

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  (this->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
  (this->super_ImGuiViewport).ParentViewportId = 0;
  (this->super_ImGuiViewport).ID = 0;
  (this->super_ImGuiViewport).Flags = 0;
  (this->super_ImGuiViewport).Pos.x = 0.0;
  (this->super_ImGuiViewport).Pos.y = 0.0;
  (this->super_ImGuiViewport).Size.x = 0.0;
  (this->super_ImGuiViewport).Size.y = 0.0;
  (this->super_ImGuiViewport).WorkOffsetMin.x = 0.0;
  (this->super_ImGuiViewport).WorkOffsetMin.y = 0.0;
  *(undefined8 *)&(this->super_ImGuiViewport).WorkOffsetMin.y = 0;
  *(undefined8 *)&(this->super_ImGuiViewport).WorkOffsetMax.y = 0;
  (this->super_ImGuiViewport).RendererUserData = (void *)0x0;
  (this->super_ImGuiViewport).PlatformUserData = (void *)0x0;
  (this->super_ImGuiViewport).PlatformHandle = (void *)0x0;
  (this->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
  *(undefined4 *)((long)&(this->super_ImGuiViewport).PlatformHandleRaw + 7) = 0;
  (this->LastPos).x = 0.0;
  (this->LastPos).y = 0.0;
  (this->DrawDataP).Valid = false;
  (this->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (this->DrawDataP).CmdListsCount = 0;
  (this->DrawDataP).TotalIdxCount = 0;
  (this->DrawDataP).TotalVtxCount = 0;
  (this->DrawDataP).DisplayPos.x = 0.0;
  *(undefined8 *)&(this->DrawDataP).DisplayPos.y = 0;
  (this->DrawDataP).DisplaySize.x = 0.0;
  (this->DrawDataP).DisplaySize.y = 0.0;
  (this->DrawDataP).FramebufferScale.x = 0.0;
  (this->DrawDataP).FramebufferScale.y = 0.0;
  (this->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
  (this->DrawDataBuilder).Layers[0].Size = 0;
  (this->DrawDataBuilder).Layers[0].Capacity = 0;
  (this->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  (this->DrawDataBuilder).Layers[1].Size = 0;
  (this->DrawDataBuilder).Layers[1].Capacity = 0;
  (this->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  (this->LastPlatformPos).x = 0.0;
  (this->LastPlatformPos).y = 0.0;
  (this->LastPlatformSize).x = 0.0;
  (this->LastPlatformSize).y = 0.0;
  (this->LastRendererSize).x = 0.0;
  (this->LastRendererSize).y = 0.0;
  (this->CurrWorkOffsetMin).x = 0.0;
  (this->CurrWorkOffsetMin).y = 0.0;
  (this->CurrWorkOffsetMax).x = 0.0;
  (this->CurrWorkOffsetMax).y = 0.0;
  *(undefined4 *)&(this->super_ImGuiViewport).field_0x64 = 0xffffffff;
  this->LastFrameActive = -1;
  this->LastFrameDrawLists[0] = -1;
  this->LastFrameDrawLists[1] = -1;
  this->LastFrontMostStampCount = -1;
  this->LastNameHash = 0;
  this->LastAlpha = 1.0;
  this->Alpha = 1.0;
  this->PlatformMonitor = -1;
  this->PlatformWindowCreated = false;
  this->Window = (ImGuiWindow *)0x0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  this->DrawLists[1] = (ImDrawList *)0x0;
  (this->LastRendererSize).x = 3.4028235e+38;
  (this->LastRendererSize).y = 3.4028235e+38;
  (this->LastPlatformSize).x = 3.4028235e+38;
  (this->LastPlatformSize).y = 3.4028235e+38;
  (this->LastPlatformPos).x = 3.4028235e+38;
  (this->LastPlatformPos).y = 3.4028235e+38;
  return;
}

Assistant:

ImGuiViewportP()                { Idx = -1; LastFrameActive = LastFrameDrawLists[0] = LastFrameDrawLists[1] = LastFrontMostStampCount = -1; LastNameHash = 0; Alpha = LastAlpha = 1.0f; PlatformMonitor = -1; PlatformWindowCreated = false; Window = NULL; DrawLists[0] = DrawLists[1] = NULL; LastPlatformPos = LastPlatformSize = LastRendererSize = ImVec2(FLT_MAX, FLT_MAX); }